

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O2

Token __thiscall slang::syntax::SyntaxNode::getLastToken(SyntaxNode *this)

{
  size_t index;
  SyntaxNode *pSVar1;
  Token TVar2;
  ConstTokenOrSyntax child;
  Token local_40;
  ConstTokenOrSyntax local_30;
  
  index = getChildCount(this);
  do {
    do {
      while( true ) {
        if ((long)index < 1) {
          parsing::Token::Token(&local_40);
          return local_40;
        }
        index = index - 1;
        getChild(&local_30,this,index);
        if (local_30.super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
            super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
            super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
            super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
            super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
            super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
            super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
            _M_index != '\0') break;
        TVar2 = ConstTokenOrSyntax::token(&local_30);
        if (TVar2.info != (Info *)0x0) {
          TVar2 = ConstTokenOrSyntax::token(&local_30);
          return TVar2;
        }
      }
      pSVar1 = ConstTokenOrSyntax::node(&local_30);
    } while (pSVar1 == (SyntaxNode *)0x0);
    pSVar1 = ConstTokenOrSyntax::node(&local_30);
    local_40 = getLastToken(pSVar1);
  } while (local_40.info == (Info *)0x0);
  return local_40;
}

Assistant:

parsing::Token SyntaxNode::getLastToken() const {
    size_t childCount = getChildCount();
    for (ptrdiff_t i = ptrdiff_t(childCount) - 1; i >= 0; i--) {
        auto child = getChild(size_t(i));
        if (child.isToken()) {
            if (child.token())
                return child.token();
        }
        else if (child.node()) {
            auto result = child.node()->getLastToken();
            if (result)
                return result;
        }
    }
    return Token();
}